

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall clipp::parser::add_miss_candidates_after(parser *this,scoped_dfs_traverser *match)

{
  bool bVar1;
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  *this_00;
  dfs_traverser npos;
  group *newRepGroup;
  anon_class_16_2_5d972bcf local_58;
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  local_48;
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  local_30;
  
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::vector(&npos.stack_,
           (vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            *)match);
  bVar1 = group::depth_first_traverser::is_alternative(&npos,0);
  if (bVar1) {
    group::depth_first_traverser::skip_alternatives(&npos);
  }
  group::depth_first_traverser::operator++(&npos);
  newRepGroup = group::depth_first_traverser::innermost_repeat_group(&match->pos_);
  if (newRepGroup == (group *)0x0) {
    bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking
                      ((match->pos_).stack_.
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current);
    if (!bVar1) goto LAB_00109c9c;
    bVar1 = group::child_t<clipp::parameter,_clipp::group>::required
                      ((match->pos_).stack_.
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current);
    if (bVar1) goto LAB_00109c9c;
    if ((int)(((long)npos.stack_.
                     super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)npos.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) <
        (int)(((long)(match->pos_).stack_.
                     super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(match->pos_).stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18)) goto LAB_00109c9c;
    local_30._M_impl.super__Vector_impl_data._M_start =
         npos.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_30._M_impl.super__Vector_impl_data._M_finish =
         npos.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_30._M_impl.super__Vector_impl_data._M_end_of_storage =
         npos.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    npos.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    npos.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    npos.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.this = this;
    for_each_potential_miss<clipp::parser::add_miss_candidates_after(clipp::detail::scoped_dfs_traverser_const&)::_lambda(clipp::group::depth_first_traverser_const&)_2_>
              ((dfs_traverser *)&local_30,(anon_class_8_1_8991fb9c *)&local_58);
    this_00 = &local_30;
  }
  else {
    if ((this->pos_).repeatGroupStarted_ != true) goto LAB_00109c9c;
    local_48._M_impl.super__Vector_impl_data._M_start =
         npos.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         npos.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
         npos.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    npos.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    npos.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    npos.stack_.
    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.newRepGroup = &newRepGroup;
    local_58.this = this;
    for_each_potential_miss<clipp::parser::add_miss_candidates_after(clipp::detail::scoped_dfs_traverser_const&)::_lambda(clipp::group::depth_first_traverser_const&)_1_>
              ((dfs_traverser *)&local_48,&local_58);
    this_00 = &local_48;
  }
  std::
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::~_Vector_base(this_00);
LAB_00109c9c:
  std::
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::~_Vector_base((_Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   *)&npos);
  return;
}

Assistant:

void add_miss_candidates_after(const scoped_dfs_traverser& match)
    {
        auto npos = match.base();
        if(npos.is_alternative()) npos.skip_alternatives();
        ++npos;
        //need to add potential misses if:
        //either new repeat group was started
        const auto newRepGroup = match.innermost_repeat_group();
        if(newRepGroup) {
            if(pos_.start_of_repeat_group()) {
                for_each_potential_miss(std::move(npos),
                    [&,this](const dfs_traverser& pos) {
                        //only add candidates within repeat group
                        if(newRepGroup == pos.innermost_repeat_group()) {
                            missCand_.emplace_back(pos, index_, true);
                        }
                    });
            }
        }
        //... or an optional blocking param was hit
        else if(match->blocking() && !match->required() &&
            npos.level() >= match.base().level())
        {
            for_each_potential_miss(std::move(npos),
                [&,this](const dfs_traverser& pos) {
                    //only add new candidates
                    if(std::find_if(missCand_.begin(), missCand_.end(),
                        [&](const miss_candidate& c){
                            return &(*c.pos) == &(*pos);
                        }) == missCand_.end())
                    {
                        missCand_.emplace_back(pos, index_);
                    }
                });
        }

    }